

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  void *pvVar1;
  Arena *pAVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  uint uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  DescriptorProto *proto_00;
  FieldDescriptorProto *pFVar7;
  FieldDescriptor *pFVar8;
  OneofDescriptor *pOVar9;
  DescriptorStringView psVar10;
  char *pcVar11;
  FieldDescriptor **v1;
  FieldDescriptor **v2;
  LogMessage *pLVar12;
  OneofDescriptorProto *pOVar13;
  long lVar14;
  long lVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  string_view sVar16;
  int local_270;
  int local_26c;
  int i_6;
  int first_synthetic;
  FieldDescriptor *field;
  undefined1 local_248 [4];
  int i_5;
  AlphaNum local_218;
  AlphaNum local_1e8;
  undefined1 local_1b8 [40];
  char *local_190;
  OneofDescriptor *local_188;
  OneofDescriptor *oneof_decl_1;
  undefined1 auStack_178 [4];
  int i_4;
  undefined8 local_170;
  LogMessageFatal local_168 [23];
  Voidify local_151;
  FieldDescriptor *local_150;
  FieldDescriptor *local_148;
  string *local_140;
  string *absl_log_internal_check_op_result;
  OneofDescriptor *out_oneof_decl;
  OneofDescriptor **local_128;
  OneofDescriptor **local_120;
  VoidPtr local_118;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_110;
  AlphaNum local_f8;
  AlphaNum local_c8;
  AlphaNum local_98;
  undefined1 local_68 [32];
  string_view local_48;
  OneofDescriptor *local_38;
  OneofDescriptor *oneof_decl;
  int i_3;
  int i_2;
  int i_1;
  int i;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  _i_1 = proto;
  proto_local = (DescriptorProto *)message;
  message_local = (Descriptor *)this;
  for (i_2 = 0; iVar6 = i_2, iVar5 = Descriptor::nested_type_count((Descriptor *)proto_local),
      iVar6 < iVar5; i_2 = i_2 + 1) {
    pvVar1 = (proto_local->field_0)._impl_.enum_type_.super_RepeatedPtrFieldBase.tagged_rep_or_elem_
    ;
    lVar14 = (long)i_2;
    proto_00 = DescriptorProto::nested_type(_i_1,i_2);
    CrossLinkMessage(this,(Descriptor *)((long)pvVar1 + lVar14 * 0x98),proto_00);
  }
  for (i_3 = 0; iVar6 = i_3, iVar5 = Descriptor::field_count((Descriptor *)proto_local),
      iVar6 < iVar5; i_3 = i_3 + 1) {
    lVar14 = *(long *)&(proto_local->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase.
                       current_size_;
    lVar15 = (long)i_3;
    pFVar7 = DescriptorProto::field(_i_1,i_3);
    CrossLinkField(this,(FieldDescriptor *)(lVar14 + lVar15 * 0x58),pFVar7);
  }
  oneof_decl._4_4_ = 0;
  while( true ) {
    iVar6 = oneof_decl._4_4_;
    iVar5 = Descriptor::extension_count((Descriptor *)proto_local);
    if (iVar5 <= iVar6) break;
    pvVar1 = (proto_local->field_0)._impl_.extension_range_.super_RepeatedPtrFieldBase.
             tagged_rep_or_elem_;
    lVar14 = (long)oneof_decl._4_4_;
    pFVar7 = DescriptorProto::extension(_i_1,oneof_decl._4_4_);
    CrossLinkField(this,(FieldDescriptor *)((long)pvVar1 + lVar14 * 0x58),pFVar7);
    oneof_decl._4_4_ = oneof_decl._4_4_ + 1;
  }
  oneof_decl._0_4_ = 0;
  while( true ) {
    uVar3 = (uint)oneof_decl;
    iVar6 = Descriptor::field_count((Descriptor *)proto_local);
    if (iVar6 <= (int)uVar3) break;
    pcVar11 = (char *)(ulong)(uint)oneof_decl;
    pFVar8 = Descriptor::field((Descriptor *)proto_local,(uint)oneof_decl);
    local_38 = FieldDescriptor::containing_oneof(pFVar8);
    if (local_38 != (OneofDescriptor *)0x0) {
      iVar5 = OneofDescriptor::field_count(local_38);
      iVar6 = extraout_EDX;
      if (0 < iVar5) {
        pcVar11 = (char *)(ulong)((uint)oneof_decl - 1);
        pFVar8 = Descriptor::field((Descriptor *)proto_local,(uint)oneof_decl - 1);
        pOVar9 = FieldDescriptor::containing_oneof(pFVar8);
        iVar6 = extraout_EDX_00;
        if (pOVar9 != local_38) {
          psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_98,psVar10);
          absl::lts_20240722::AlphaNum::AlphaNum(&local_c8,".");
          pFVar8 = Descriptor::field((Descriptor *)proto_local,(uint)oneof_decl - 1);
          psVar10 = FieldDescriptor::name_abi_cxx11_(pFVar8);
          absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_f8,psVar10);
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_68,&local_98,&local_c8);
          sVar16 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
          local_48 = sVar16;
          pFVar7 = DescriptorProto::field(_i_1,(uint)oneof_decl - 1);
          out_oneof_decl = (OneofDescriptor *)&proto_local;
          local_128 = &oneof_decl;
          local_120 = &local_38;
          absl::lts_20240722::FunctionRef<std::__cxx11::string()>::
          FunctionRef<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,void>
                    ((FunctionRef<std::__cxx11::string()> *)&local_118,
                     (anon_class_24_3_cbf49681 *)&out_oneof_decl);
          make_error.invoker_ = p_Stack_110;
          make_error.ptr_.obj = local_118.obj;
          pcVar11 = (char *)local_48._M_len;
          AddError(this,local_48,&pFVar7->super_Message,TYPE,make_error);
          std::__cxx11::string::~string((string *)local_68);
          iVar6 = extraout_EDX_01;
        }
      }
      pAVar2 = (proto_local->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase.arena_;
      pcVar11 = OneofDescriptor::index(local_38,pcVar11,iVar6);
      absl_log_internal_check_op_result =
           (string *)(&(pAVar2->impl_).tag_and_id_ + (long)(int)pcVar11 * 7);
      if (*(int *)&absl_log_internal_check_op_result->field_0x4 == 0) {
        pFVar8 = Descriptor::field((Descriptor *)proto_local,(uint)oneof_decl);
        absl_log_internal_check_op_result[1].field_2._M_allocated_capacity = (size_type)pFVar8;
      }
      if ((this->had_errors_ & 1U) == 0) {
        local_148 = (FieldDescriptor *)
                    (absl_log_internal_check_op_result[1].field_2._M_allocated_capacity +
                    (long)*(int *)&absl_log_internal_check_op_result->field_0x4 * 0x58);
        v1 = absl::lts_20240722::log_internal::
             GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&local_148);
        local_150 = Descriptor::field((Descriptor *)proto_local,(uint)oneof_decl);
        v2 = absl::lts_20240722::log_internal::
             GetReferenceableValue<google::protobuf::FieldDescriptor_const*>(&local_150);
        local_140 = absl::lts_20240722::log_internal::
                    Check_EQImpl<google::protobuf::FieldDescriptor_const*,google::protobuf::FieldDescriptor_const*>
                              (v1,v2,
                               "out_oneof_decl.fields_ + out_oneof_decl.field_count_ == message->field(i)"
                              );
        if (local_140 != (string *)0x0) {
          _auStack_178 = std::__cxx11::string::operator_cast_to_basic_string_view
                                   ((string *)local_140);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_168,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.cc"
                     ,0x1c8c,auStack_178._0_8_,auStack_178._8_8_);
          pLVar12 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_168);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_151,pLVar12);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_168);
        }
        local_140 = (string *)0x0;
      }
      *(int *)&absl_log_internal_check_op_result->field_0x4 =
           *(int *)&absl_log_internal_check_op_result->field_0x4 + 1;
    }
    oneof_decl._0_4_ = (uint)oneof_decl + 1;
  }
  oneof_decl_1._4_4_ = 0;
  while( true ) {
    iVar6 = oneof_decl_1._4_4_;
    iVar5 = Descriptor::oneof_decl_count((Descriptor *)proto_local);
    if (iVar5 <= iVar6) break;
    local_188 = (OneofDescriptor *)
                (&(((proto_local->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase.arena_)->
                  impl_).tag_and_id_ + (long)oneof_decl_1._4_4_ * 7);
    iVar6 = OneofDescriptor::field_count(local_188);
    if (iVar6 == 0) {
      psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>(&local_1e8,psVar10);
      absl::lts_20240722::AlphaNum::AlphaNum(&local_218,".");
      psVar10 = OneofDescriptor::name_abi_cxx11_(local_188);
      absl::lts_20240722::AlphaNum::AlphaNum<std::allocator<char>>((AlphaNum *)local_248,psVar10);
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1b8,&local_1e8,&local_218);
      sVar16 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1b8);
      unique0x10000b34 = sVar16;
      pOVar13 = DescriptorProto::oneof_decl(_i_1,oneof_decl_1._4_4_);
      AddError(this,stack0xfffffffffffffe68,&pOVar13->super_Message,NAME,
               "Oneof must have at least one field.");
      std::__cxx11::string::~string((string *)local_1b8);
    }
    oneof_decl_1._4_4_ = oneof_decl_1._4_4_ + 1;
  }
  field._4_4_ = 0;
  do {
    iVar6 = Descriptor::field_count((Descriptor *)proto_local);
    if (iVar6 <= field._4_4_) {
      local_26c = -1;
      local_270 = 0;
      while( true ) {
        iVar6 = Descriptor::oneof_decl_count((Descriptor *)proto_local);
        if (iVar6 <= local_270) break;
        pOVar9 = Descriptor::oneof_decl((Descriptor *)proto_local,local_270);
        bVar4 = OneofDescriptor::is_synthetic(pOVar9);
        if (bVar4) {
          if (local_26c == -1) {
            local_26c = local_270;
          }
        }
        else if (local_26c != -1) {
          psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
          sVar16 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar10);
          pOVar13 = DescriptorProto::oneof_decl(_i_1,local_270);
          AddError(this,sVar16,&pOVar13->super_Message,OTHER,
                   "Synthetic oneofs must be after all other oneofs");
        }
        local_270 = local_270 + 1;
      }
      if (local_26c == -1) {
        *(undefined4 *)((long)&proto_local->field_0 + 0x6c) =
             *(undefined4 *)((long)&proto_local->field_0 + 0x68);
      }
      else {
        *(int *)((long)&proto_local->field_0 + 0x6c) = local_26c;
      }
      return;
    }
    pFVar8 = Descriptor::field((Descriptor *)proto_local,field._4_4_);
    if (((byte)pFVar8->field_0x1 >> 1 & 1) != 0) {
      pOVar9 = FieldDescriptor::containing_oneof(pFVar8);
      if (pOVar9 != (OneofDescriptor *)0x0) {
        pOVar9 = FieldDescriptor::containing_oneof(pFVar8);
        bVar4 = OneofDescriptor::is_synthetic(pOVar9);
        if (bVar4) goto LAB_00253ca4;
      }
      psVar10 = Descriptor::full_name_abi_cxx11_((Descriptor *)proto_local);
      sVar16 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar10);
      pFVar7 = DescriptorProto::field(_i_1,field._4_4_);
      AddError(this,sVar16,&pFVar7->super_Message,OTHER,
               "Fields with proto3_optional set must be a member of a one-field oneof");
    }
LAB_00253ca4:
    field._4_4_ = field._4_4_ + 1;
  } while( true );
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(
            absl::StrCat(message->full_name(), ".",
                         message->field(i - 1)->name()),
            proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE, [&] {
              return absl::Substitute(
                  "Fields in the same oneof must be defined consecutively. "
                  "\"$0\" cannot be defined before the completion of the "
                  "\"$1\" oneof definition.",
                  message->field(i - 1)->name(), oneof_decl->name());
            });
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      auto& out_oneof_decl = message->oneof_decls_[oneof_decl->index()];
      if (out_oneof_decl.field_count_ == 0) {
        out_oneof_decl.fields_ = message->field(i);
      }

      if (!had_errors_) {
        // Verify that they are contiguous.
        // This is assumed by OneofDescriptor::field(i).
        // But only if there are no errors.
        ABSL_CHECK_EQ(out_oneof_decl.fields_ + out_oneof_decl.field_count_,
                      message->field(i));
      }
      ++out_oneof_decl.field_count_;
    }
  }

  // Then verify the sizes.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(absl::StrCat(message->full_name(), ".", oneof_decl->name()),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }
  }

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->proto3_optional_) {
      if (!field->containing_oneof() ||
          !field->containing_oneof()->is_synthetic()) {
        AddError(message->full_name(), proto.field(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Fields with proto3_optional set must be "
                 "a member of a one-field oneof");
      }
    }
  }

  // Synthetic oneofs must be last.
  int first_synthetic = -1;
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    if (message->oneof_decl(i)->is_synthetic()) {
      if (first_synthetic == -1) {
        first_synthetic = i;
      }
    } else {
      if (first_synthetic != -1) {
        AddError(message->full_name(), proto.oneof_decl(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
    }
  }

  if (first_synthetic == -1) {
    message->real_oneof_decl_count_ = message->oneof_decl_count_;
  } else {
    message->real_oneof_decl_count_ = first_synthetic;
  }
}